

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet.c
# Opt level: O1

int pt_pkt_read_ip(pt_packet_ip *packet,uint8_t *pos,pt_config *config)

{
  bool bVar1;
  byte bVar2;
  uint64_t val;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  pt_ip_compression pVar6;
  pt_ip_compression pVar7;
  pt_ip_compression pVar8;
  
  if (config == (pt_config *)0x0 || (pos == (uint8_t *)0x0 || packet == (pt_packet_ip *)0x0)) {
    return -1;
  }
  pVar6 = (pt_ip_compression)(*pos >> 5);
  switch(pVar6) {
  case pt_ipc_suppressed:
    bVar1 = false;
    bVar2 = 0;
    bVar4 = 0;
    pVar7 = pVar6;
    goto LAB_0010e7f7;
  case pt_ipc_update_16:
    pVar7 = pt_ipc_update_32;
    break;
  case pt_ipc_update_32:
    pVar7 = pt_ipc_update_48;
    break;
  case pt_ipc_sext_48:
  case pt_ipc_update_48:
    pVar7 = pt_ipc_full;
    break;
  default:
    bVar1 = true;
    bVar4 = 0;
    bVar2 = 1;
    pVar7 = ~pt_ipc_update_48;
    goto LAB_0010e7f7;
  case pt_ipc_full:
    pVar7 = 8;
  }
  bVar2 = 1;
  bVar1 = false;
  bVar4 = 1;
LAB_0010e7f7:
  pVar8 = pVar7;
  if (!bVar1) {
    pVar8 = ~pt_ipc_full;
    if (pos + (ulong)pVar7 + 1 <= config->end) {
      if ((bool)(bVar2 & bVar4)) {
        bVar4 = 0;
        uVar5 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 | (ulong)pos[uVar5 + 1] << (bVar4 & 0x3f);
          uVar5 = uVar5 + 1;
          bVar4 = bVar4 + 8;
        } while (pVar7 != uVar5);
      }
      else {
        uVar3 = 0;
      }
      packet->ipc = pVar6;
      packet->ip = uVar3;
      pVar8 = pVar7 + pt_ipc_update_16;
    }
  }
  return pVar8;
}

Assistant:

int pt_pkt_read_ip(struct pt_packet_ip *packet, const uint8_t *pos,
		   const struct pt_config *config)
{
	uint64_t ip;
	uint8_t ipc;
	int ipsize;

	if (!packet || !pos || !config)
		return -pte_internal;

	ipc = (*pos++ >> pt_opm_ipc_shr) & pt_opm_ipc_shr_mask;

	ip = 0ull;
	ipsize = pt_pkt_ip_size((enum pt_ip_compression) ipc);
	if (ipsize < 0)
		return ipsize;

	if (config->end < pos + ipsize)
		return -pte_eos;

	if (ipsize)
		ip = pt_pkt_read_value(pos, ipsize);

	packet->ipc = (enum pt_ip_compression) ipc;
	packet->ip = ip;

	return ipsize + 1;
}